

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool InputTextFilterCharacter
               (uint *p_char,ImGuiInputTextFlags flags,ImGuiInputTextCallback callback,
               void *user_data)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ImGuiInputTextCallbackData callback_data;
  ImGuiInputTextCallbackData local_68;
  
  uVar4 = *p_char;
  if (uVar4 < 0x20) {
    if ((((byte)((uint)flags >> 0x14) & uVar4 == 10) == 0) &&
       (((uint)flags >> 10 & 1) == 0 || uVar4 != 9)) {
      return false;
    }
  }
  else if (uVar4 == 0x7f) {
    return false;
  }
  if (0xffff < uVar4 || uVar4 - 0xe000 < 0x1900) {
    return false;
  }
  if ((flags & 0x2000fU) == 0) goto LAB_0015f6cd;
  uVar1 = uVar4 - 0x30;
  if ((uVar1 < 10 || (flags & 1U) == 0) || (uVar4 == (int)GImGui->PlatformLocaleDecimalPoint)) {
LAB_0015f61b:
    if ((((((((uint)flags >> 0x11 & 1) == 0 || uVar1 < 10) || ((uVar4 & 0xffdf) == 0x45)) ||
          (uVar4 == 0x2f)) || ((0xfffffffd < uVar4 - 0x2c || (uVar4 == 0x2d)))) ||
        (uVar4 == (int)GImGui->PlatformLocaleDecimalPoint)) &&
       ((uVar4 - 0x41 < 6 || (flags & 2U) == 0) || (uVar4 - 0x61 < 6 || uVar1 < 10))) {
      if ((uVar4 - 0x61 < 0x1a & (byte)((uint)flags >> 2) & 0x3f) == 1) {
        uVar4 = uVar4 - 0x20;
        *p_char = uVar4;
      }
      bVar2 = true;
      if (((flags & 8U) == 0) || (((uVar4 != 9 && (uVar4 != 0x20)) && (uVar4 != 0x3000))))
      goto LAB_0015f6c9;
    }
    bVar2 = false;
  }
  else {
    bVar2 = false;
    if (((ushort)uVar4 < 0x30) &&
       (bVar2 = false, (0xac0000000000U >> ((ulong)(uVar4 & 0xffff) & 0x3f) & 1) != 0))
    goto LAB_0015f61b;
  }
LAB_0015f6c9:
  if (!bVar2) {
    return false;
  }
LAB_0015f6cd:
  if (((uint)flags >> 9 & 1) == 0) {
    return true;
  }
  ImGuiInputTextCallbackData::ImGuiInputTextCallbackData(&local_68);
  local_68.Buf = (char *)0x0;
  local_68.BufTextLen = 0;
  local_68.BufSize = 0;
  local_68.BufDirty = false;
  local_68._41_3_ = 0;
  local_68.CursorPos = 0;
  local_68.SelectionStart = 0;
  local_68.SelectionEnd = 0;
  local_68._18_6_ = 0;
  local_68.EventChar = (ushort)uVar4;
  local_68.Flags = flags;
  local_68.EventFlag = 0x200;
  local_68.UserData = user_data;
  iVar3 = (*callback)(&local_68);
  if (iVar3 == 0) {
    *p_char = (uint)local_68.EventChar;
    if (local_68.EventChar != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

static bool InputTextFilterCharacter(unsigned int* p_char, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    unsigned int c = *p_char;

    // Filter non-printable (NB: isprint is unreliable! see #2467)
    if (c < 0x20)
    {
        bool pass = false;
        pass |= (c == '\n' && (flags & ImGuiInputTextFlags_Multiline));
        pass |= (c == '\t' && (flags & ImGuiInputTextFlags_AllowTabInput));
        if (!pass)
            return false;
    }

    // We ignore Ascii representation of delete (emitted from Backspace on OSX, see #2578, #2817)
    if (c == 127)
        return false;

    // Filter private Unicode range. GLFW on OSX seems to send private characters for special keys like arrow keys (FIXME)
    if (c >= 0xE000 && c <= 0xF8FF)
        return false;

    // Filter Unicode ranges we are not handling in this build.
    if (c > IM_UNICODE_CODEPOINT_MAX)
        return false;

    // Generic named filters
    if (flags & (ImGuiInputTextFlags_CharsDecimal | ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase | ImGuiInputTextFlags_CharsNoBlank | ImGuiInputTextFlags_CharsScientific))
    {
        // The libc allows overriding locale, with e.g. 'setlocale(LC_NUMERIC, "de_DE.UTF-8");' which affect the output/input of printf/scanf.
        // The standard mandate that programs starts in the "C" locale where the decimal point is '.'.
        // We don't really intend to provide widespread support for it, but out of empathy for people stuck with using odd API, we support the bare minimum aka overriding the decimal point.
        // Change the default decimal_point with:
        //   ImGui::GetCurrentContext()->PlatformLocaleDecimalPoint = *localeconv()->decimal_point;
        ImGuiContext& g = *GImGui;
        const unsigned c_decimal_point = (unsigned int)g.PlatformLocaleDecimalPoint;

        // Allow 0-9 . - + * /
        if (flags & ImGuiInputTextFlags_CharsDecimal)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/'))
                return false;

        // Allow 0-9 . - + * / e E
        if (flags & ImGuiInputTextFlags_CharsScientific)
            if (!(c >= '0' && c <= '9') && (c != c_decimal_point) && (c != '-') && (c != '+') && (c != '*') && (c != '/') && (c != 'e') && (c != 'E'))
                return false;

        // Allow 0-9 a-F A-F
        if (flags & ImGuiInputTextFlags_CharsHexadecimal)
            if (!(c >= '0' && c <= '9') && !(c >= 'a' && c <= 'f') && !(c >= 'A' && c <= 'F'))
                return false;

        // Turn a-z into A-Z
        if (flags & ImGuiInputTextFlags_CharsUppercase)
            if (c >= 'a' && c <= 'z')
                *p_char = (c += (unsigned int)('A' - 'a'));

        if (flags & ImGuiInputTextFlags_CharsNoBlank)
            if (ImCharIsBlankW(c))
                return false;
    }

    // Custom callback filter
    if (flags & ImGuiInputTextFlags_CallbackCharFilter)
    {
        ImGuiInputTextCallbackData callback_data;
        memset(&callback_data, 0, sizeof(ImGuiInputTextCallbackData));
        callback_data.EventFlag = ImGuiInputTextFlags_CallbackCharFilter;
        callback_data.EventChar = (ImWchar)c;
        callback_data.Flags = flags;
        callback_data.UserData = user_data;
        if (callback(&callback_data) != 0)
            return false;
        *p_char = callback_data.EventChar;
        if (!callback_data.EventChar)
            return false;
    }

    return true;
}